

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

reference __thiscall
jsoncons::jmespath::
eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::string_type_name(eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *this)

{
  int iVar1;
  string sStack_28;
  
  if (eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::string_type_name()::string_type_name == '\0') {
    iVar1 = __cxa_guard_acquire(&eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::string_type_name()::string_type_name);
    if (iVar1 != 0) {
      string_constant_of_type<char>(&sStack_28,"string",L"string");
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                (&string_type_name::string_type_name,&sStack_28);
      std::__cxx11::string::~string((string *)&sStack_28);
      __cxa_atexit(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                   ~basic_json,&string_type_name::string_type_name,&__dso_handle);
      __cxa_guard_release(&eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::string_type_name()::string_type_name);
    }
  }
  return &string_type_name::string_type_name;
}

Assistant:

reference string_type_name()
        {
            static Json string_type_name(JSONCONS_STRING_CONSTANT(char_type, "string"));

            return string_type_name;
        }